

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O2

int u8_charnum(char *s,int offset)

{
  int iVar1;
  char *pcVar2;
  char *string;
  
  pcVar2 = s + offset;
  iVar1 = 0;
  for (; (s < pcVar2 && (*s != '\0')); s = s + 1) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int u8_charnum(const char *s, int offset)
{
    int charnum = 0;
    const char *string = s;
    const char *const end = string + offset;

    while (string < end && *string != '\0') {
        if (*string++ & 0x80) {
            if (!isutf(*string)) {
                ++string;
                if (!isutf(*string)) {
                    ++string;
                    if (!isutf(*string)) {
                        ++string;
                    }
                }
            }
        }
        ++charnum;
    }
    return charnum;
}